

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long in_RSI;
  int in_EDI;
  char *in_file;
  WebPData webp_data;
  int version;
  WebPInfo webp_info;
  WebPInfoStatus webp_info_status;
  int parse_bitstream;
  int show_summary;
  int show_diag;
  int quiet;
  int c;
  WebPData *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  WebPData *in_stack_ffffffffffffff78;
  WebPInfo *in_stack_ffffffffffffff80;
  WebPInfoStatus local_28;
  int local_14;
  uint local_4;
  
  bVar2 = false;
  local_28 = WEBP_INFO_OK;
  if (in_EDI == 1) {
    Help();
    local_4 = 1;
  }
  else {
    for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
      iVar3 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"-h");
      if ((((iVar3 == 0) ||
           (iVar3 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"-help"), iVar3 == 0)) ||
          (iVar3 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"-H"), iVar3 == 0)) ||
         (iVar3 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"-longhelp"), iVar3 == 0)) {
        Help();
        return 0;
      }
      iVar3 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"-quiet");
      if (iVar3 == 0) {
        bVar2 = true;
      }
      else {
        iVar3 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"-diag");
        if (((iVar3 != 0) &&
            (iVar3 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"-summary"), iVar3 != 0)) &&
           (iVar3 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"-bitstream_info"), iVar3 != 0))
        {
          iVar3 = strcmp(*(char **)(in_RSI + (long)local_14 * 8),"-version");
          if (iVar3 == 0) {
            uVar4 = WebPGetDecoderVersion();
            printf("WebP Decoder version: %d.%d.%d\n",(ulong)((int)uVar4 >> 0x10 & 0xff),
                   (ulong)((int)uVar4 >> 8 & 0xff),(ulong)(uVar4 & 0xff));
            return 0;
          }
          break;
        }
      }
    }
    if (local_14 == in_EDI) {
      Help();
      local_4 = 1;
    }
    else {
      for (; local_14 < in_EDI; local_14 = local_14 + 1) {
        WebPInfoInit((WebPInfo *)0x1025ff);
        lVar1 = *(long *)(in_RSI + (long)local_14 * 8);
        if ((lVar1 == 0) ||
           (iVar3 = ReadFileToWebPData(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40),
           iVar3 == 0)) {
          local_28 = WEBP_INFO_INVALID_COMMAND;
          fprintf(_stderr,"Failed to open input file %s.\n",lVar1);
        }
        else {
          if (!bVar2) {
            printf("File: %s\n",lVar1);
          }
          local_28 = AnalyzeWebP(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          WebPDataClear((WebPData *)0x1026ce);
        }
      }
      local_4 = (uint)(local_28 != WEBP_INFO_OK);
    }
  }
  return local_4;
}

Assistant:

int main(int argc, const char* argv[]) {
  int c, quiet = 0, show_diag = 0, show_summary = 0;
  int parse_bitstream = 0;
  WebPInfoStatus webp_info_status = WEBP_INFO_OK;
  WebPInfo webp_info;

  INIT_WARGV(argc, argv);

  if (argc == 1) {
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  // Parse command-line input.
  for (c = 1; c < argc; ++c) {
    if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help") ||
        !strcmp(argv[c], "-H") || !strcmp(argv[c], "-longhelp")) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-diag")) {
      show_diag = 1;
    } else if (!strcmp(argv[c], "-summary")) {
      show_summary = 1;
    } else if (!strcmp(argv[c], "-bitstream_info")) {
      parse_bitstream = 1;
    } else if (!strcmp(argv[c], "-version")) {
      const int version = WebPGetDecoderVersion();
      printf("WebP Decoder version: %d.%d.%d\n",
             (version >> 16) & 0xff, (version >> 8) & 0xff, version & 0xff);
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else {  // Assume the remaining are all input files.
      break;
    }
  }

  if (c == argc) {
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  // Process input files one by one.
  for (; c < argc; ++c) {
    WebPData webp_data;
    const W_CHAR* in_file = NULL;
    WebPInfoInit(&webp_info);
    webp_info.quiet_ = quiet;
    webp_info.show_diagnosis_ = show_diag;
    webp_info.show_summary_ = show_summary;
    webp_info.parse_bitstream_ = parse_bitstream;
    in_file = GET_WARGV(argv, c);
    if (in_file == NULL ||
        !ReadFileToWebPData((const char*)in_file, &webp_data)) {
      webp_info_status = WEBP_INFO_INVALID_COMMAND;
      WFPRINTF(stderr, "Failed to open input file %s.\n", in_file);
      continue;
    }
    if (!webp_info.quiet_) WPRINTF("File: %s\n", in_file);
    webp_info_status = AnalyzeWebP(&webp_info, &webp_data);
    WebPDataClear(&webp_data);
  }
  FREE_WARGV_AND_RETURN((webp_info_status == WEBP_INFO_OK) ? EXIT_SUCCESS
                                                           : EXIT_FAILURE);
}